

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

bool igSelectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 size)

{
  bool bVar1;
  ImGuiSelectableFlags flags_local;
  bool selected_local;
  char *label_local;
  ImVec2 size_local;
  
  label_local = (char *)size;
  bVar1 = ImGui::Selectable(label,selected,flags,(ImVec2 *)&label_local);
  return bVar1;
}

Assistant:

CIMGUI_API int _igSelectable (char *larg1, int larg2, ImGuiSelectableFlags *larg3, ImVec2 const *larg4) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  bool arg2 ;
  ImGuiSelectableFlags arg3 ;
  ImVec2 arg4 ;
  bool result;
  
  arg1 = larg1;
  arg2 = (bool)larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  try {
    result = (bool)igSelectable((char const *)arg1,arg2,arg3,arg4);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}